

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O2

QString * __thiscall
FileHdrWrapper::getFieldName(QString *__return_storage_ptr__,FileHdrWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  bool bVar2;
  PEFile *this_00;
  char *ch;
  
  switch(fieldId) {
  case 0:
    ch = "Machine";
    break;
  case 1:
    ch = "Sections Count";
    break;
  case 2:
    pEVar1 = (this->super_PEElementWrapper).super_ExeElementWrapper.m_Exe;
    if (((pEVar1 == (Executable *)0x0) ||
        (this_00 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0),
        this_00 == (PEFile *)0x0)) || (bVar2 = PEFile::isReproBuild(this_00), !bVar2)) {
      ch = "Time Date Stamp";
    }
    else {
      ch = "ReproChecksum";
    }
    break;
  case 3:
    ch = "Ptr to Symbol Table";
    break;
  case 4:
    ch = "Num. of Symbols";
    break;
  case 5:
    ch = "Size of OptionalHeader";
    break;
  case 6:
    ch = "Characteristics";
    break;
  default:
    ch = "";
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString FileHdrWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
         case MACHINE: return("Machine");
         case SEC_NUM: return ("Sections Count");
         case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return "ReproChecksum";
            }
            return("Time Date Stamp");
         }
         case SYMBOL_PTR: return("Ptr to Symbol Table");
         case SYMBOL_NUM: return("Num. of Symbols");
         case OPTHDR_SIZE: return("Size of OptionalHeader");
         case CHARACT: return("Characteristics");
    }
    return "";
}